

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O1

int hostline(LIBSSH2_KNOWNHOSTS *hosts,char *host,size_t hostlen,char *key,size_t keylen)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  char *__src;
  uint uVar8;
  uint uVar9;
  LIBSSH2_SESSION *session;
  char *pcVar10;
  ulong uVar11;
  size_t __n;
  byte *pbVar12;
  byte *pbVar13;
  ulong uVar14;
  size_t commentlen;
  char *local_168;
  char saltbuf [32];
  char local_138 [264];
  
  if (keylen < 0x14) {
    iVar2 = _libssh2_error(hosts->session,-0x21,"Failed to parse known_hosts line (key too short)");
    return iVar2;
  }
  pbVar4 = (byte *)key;
  if ((byte)(*key - 0x30U) < 10) {
    uVar5 = 0x40000;
    local_168 = (char *)0x0;
    commentlen = 0;
    __n = 0;
    pcVar6 = host;
    pbVar12 = (byte *)0x0;
  }
  else {
    pbVar12 = (byte *)(key + keylen);
    do {
      if (((ulong)*pbVar4 < 0x21) && ((0x100000201U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))
      goto LAB_0011b776;
      pbVar4 = pbVar4 + 1;
      keylen = keylen - 1;
    } while (keylen != 0);
    keylen = 0;
    pbVar4 = pbVar12;
LAB_0011b776:
    __n = (long)pbVar4 - (long)key;
    pcVar6 = "ssh-dss";
    iVar2 = strncmp(key,"ssh-dss",__n);
    if (iVar2 == 0) {
      uVar5 = 0xc0000;
    }
    else {
      pcVar6 = "ssh-rsa";
      iVar2 = strncmp(key,"ssh-rsa",__n);
      if (iVar2 == 0) {
        uVar5 = 0x80000;
      }
      else {
        pcVar6 = "ecdsa-sha2-nistp256";
        iVar2 = strncmp(key,"ecdsa-sha2-nistp256",__n);
        if (iVar2 == 0) {
          uVar5 = 0x100000;
        }
        else {
          pcVar6 = "ecdsa-sha2-nistp384";
          iVar2 = strncmp(key,"ecdsa-sha2-nistp384",__n);
          if (iVar2 == 0) {
            uVar5 = 0x140000;
          }
          else {
            pcVar6 = "ecdsa-sha2-nistp521";
            iVar2 = strncmp(key,"ecdsa-sha2-nistp521",__n);
            if (iVar2 == 0) {
              uVar5 = 0x180000;
            }
            else {
              pcVar6 = "ssh-ed25519";
              iVar2 = strncmp(key,"ssh-ed25519",__n);
              uVar5 = (uint)(iVar2 != 0) << 0x15 | 0x1c0000;
            }
          }
        }
      }
    }
    lVar7 = -keylen;
    for (; (*pbVar4 == 9 || (*pbVar4 == 0x20)); pbVar4 = pbVar4 + 1) {
      lVar7 = lVar7 + 1;
    }
    commentlen = -lVar7;
    pbVar12 = pbVar4;
    if (lVar7 != 0) {
      do {
        if (((ulong)*pbVar12 < 0x21) && ((0x100000201U >> ((ulong)*pbVar12 & 0x3f) & 1) != 0))
        goto LAB_0011b8a7;
        commentlen = commentlen - 1;
        pbVar12 = pbVar12 + 1;
      } while (commentlen != 0);
      commentlen = 0;
    }
    pbVar12 = (byte *)0x0;
LAB_0011b8a7:
    keylen = -(lVar7 + commentlen);
    pbVar13 = pbVar12;
    local_168 = key;
    if (commentlen != 0) {
      pbVar13 = pbVar12 + commentlen;
      do {
        if ((*pbVar12 != 0x20) && (*pbVar12 != 9)) goto LAB_0011b8d3;
        pbVar12 = pbVar12 + 1;
        commentlen = commentlen - 1;
      } while (commentlen != 0);
    }
    commentlen = 0;
    pbVar12 = pbVar13;
  }
LAB_0011b8d3:
  if ((hostlen < 3) || (host[2] == '|' && *(short *)host == 0x317c)) {
    uVar11 = hostlen - 4;
    for (uVar14 = 0; host[uVar14 + 3] != '\0'; uVar14 = uVar14 + 1) {
      if (host[uVar14 + 3] == '|') {
        if (uVar14 < 0x1f) {
          memcpy(saltbuf,host + 3,uVar14);
          saltbuf[uVar14] = '\0';
          if (uVar11 < 0xff) {
            memcpy(local_138,host + uVar14 + 4,uVar11);
            local_138[uVar11] = '\0';
            iVar2 = knownhost_add(hosts,local_138,saltbuf,local_168,__n,(char *)pbVar4,keylen,
                                  (char *)pbVar12,commentlen,uVar5 | 0x20002,
                                  (libssh2_knownhost **)0x0);
            return iVar2;
          }
          session = hosts->session;
          pcVar6 = "Failed to parse known_hosts line (unexpected length)";
        }
        else {
          session = hosts->session;
          pcVar6 = "Failed to parse known_hosts line (unexpectedly long salt)";
        }
        iVar2 = _libssh2_error(session,-0x21,pcVar6);
        return iVar2;
      }
      uVar11 = uVar11 - 1;
    }
  }
  else if (0 < (long)hostlen) {
    uVar9 = 0;
    pcVar10 = host + hostlen;
    uVar11 = 0;
    do {
      __src = pcVar10 + -1;
      uVar14 = uVar11 + 1;
      if ((__src == host) || (pcVar10[-2] == ',')) {
        if (uVar14 < 0xff) {
          uVar8 = (uint)pcVar6;
          memcpy(local_138,__src,uVar14);
          local_138[uVar11 + 1] = '\0';
          uVar3 = knownhost_add(hosts,local_138,(char *)0x0,local_168,__n,(char *)pbVar4,keylen,
                                (char *)pbVar12,commentlen,uVar5 | 0x20001,(libssh2_knownhost **)0x0
                               );
          uVar9 = uVar3;
          if (uVar3 != 0) goto LAB_0011b9c7;
          if (host < __src) {
            uVar14 = 0;
            __src = pcVar10 + -2;
          }
          bVar1 = true;
          uVar9 = 0;
        }
        else {
          uVar3 = _libssh2_error(hosts->session,-0x21,
                                 "Failed to parse known_hosts line (unexpected length)");
LAB_0011b9c7:
          bVar1 = false;
          uVar8 = uVar3;
        }
        pcVar6 = (char *)(ulong)uVar8;
        if (!bVar1) {
          return uVar8;
        }
      }
      pcVar10 = __src;
      uVar11 = uVar14;
      if (__src <= host) {
        return uVar9;
      }
    } while( true );
  }
  return 0;
}

Assistant:

static int hostline(LIBSSH2_KNOWNHOSTS *hosts,
                    const char *host, size_t hostlen,
                    const char *key, size_t keylen)
{
    const char *comment = NULL;
    const char *key_type_name = NULL;
    size_t commentlen = 0;
    size_t key_type_len = 0;
    int key_type;

    /* make some checks that the lengths seem sensible */
    if(keylen < 20)
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Failed to parse known_hosts line "
                              "(key too short)");

    switch(key[0]) {
    case '0': case '1': case '2': case '3': case '4':
    case '5': case '6': case '7': case '8': case '9':
        key_type = LIBSSH2_KNOWNHOST_KEY_RSA1;

        /* Note that the old-style keys (RSA1) aren't truly base64, but we
         * claim it is for now since we can get away with strcmp()ing the
         * entire anything anyway! We need to check and fix these to make them
         * work properly.
         */
        break;

    default:
        key_type_name = key;
        while(keylen && *key &&
               (*key != ' ') && (*key != '\t')) {
            key++;
            keylen--;
        }
        key_type_len = key - key_type_name;

        if(!strncmp(key_type_name, "ssh-dss", key_type_len))
            key_type = LIBSSH2_KNOWNHOST_KEY_SSHDSS;
        else if(!strncmp(key_type_name, "ssh-rsa", key_type_len))
            key_type = LIBSSH2_KNOWNHOST_KEY_SSHRSA;
        else if(!strncmp(key_type_name, "ecdsa-sha2-nistp256", key_type_len))
            key_type = LIBSSH2_KNOWNHOST_KEY_ECDSA_256;
        else if(!strncmp(key_type_name, "ecdsa-sha2-nistp384", key_type_len))
            key_type = LIBSSH2_KNOWNHOST_KEY_ECDSA_384;
        else if(!strncmp(key_type_name, "ecdsa-sha2-nistp521", key_type_len))
            key_type = LIBSSH2_KNOWNHOST_KEY_ECDSA_521;
        else if(!strncmp(key_type_name, "ssh-ed25519", key_type_len))
            key_type = LIBSSH2_KNOWNHOST_KEY_ED25519;
        else
            key_type = LIBSSH2_KNOWNHOST_KEY_UNKNOWN;

        /* skip whitespaces */
        while((*key ==' ') || (*key == '\t')) {
            key++;
            keylen--;
        }

        comment = key;
        commentlen = keylen;

        /* move over key */
        while(commentlen && *comment &&
              (*comment != ' ') && (*comment != '\t')) {
            comment++;
            commentlen--;
        }

        /* reduce key by comment length */
        keylen -= commentlen;

        /* Distinguish empty comment (a space) from no comment (no space) */
        if(commentlen == 0)
            comment = NULL;

        /* skip whitespaces */
        while(commentlen && *comment &&
              ((*comment ==' ') || (*comment == '\t'))) {
            comment++;
            commentlen--;
        }
        break;
    }

    /* Figure out host format */
    if((hostlen > 2) && memcmp(host, "|1|", 3)) {
        /* old style plain text: [name]([,][name])*

           for the sake of simplicity, we add them as separate hosts with the
           same key
        */
        return oldstyle_hostline(hosts, host, hostlen, key_type_name,
                                 key_type_len, key, keylen, key_type,
                                 comment, commentlen);
    }
    else {
        /* |1|[salt]|[hash] */
        return hashed_hostline(hosts, host, hostlen, key_type_name,
                               key_type_len, key, keylen, key_type,
                               comment, commentlen);
    }
}